

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes.cpp
# Opt level: O2

void __thiscall RunContext::Run(RunContext *this)

{
  pointer ppBVar1;
  BaseNode *pBVar2;
  pointer pCVar3;
  pointer ppBVar4;
  pointer ppBVar5;
  bool bVar6;
  int iVar7;
  pointer ppBVar8;
  pointer ppBVar9;
  Connection *c;
  pointer this_00;
  
  ppBVar1 = (this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
      super__Vector_impl_data._M_finish != ppBVar1) {
    (this->pipeline).blocks.super__Vector_base<Block_*,_std::allocator<Block_*>_>._M_impl.
    super__Vector_impl_data._M_finish = ppBVar1;
  }
  ppBVar4 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  ppBVar8 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  do {
    ppBVar5 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    ppBVar9 = nodes.super__Vector_base<BaseNode_*,_std::allocator<BaseNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (ppBVar8 == ppBVar4) {
      do {
        if (ppBVar9 == ppBVar5) {
          Pipeline::Launch(&this->pipeline);
          return;
        }
        iVar7 = (*(*ppBVar9)->_vptr_BaseNode[4])(*ppBVar9,this);
        ppBVar9 = ppBVar9 + 1;
      } while ((char)iVar7 != '\0');
      return;
    }
    pBVar2 = *ppBVar8;
    pCVar3 = (pBVar2->connections).super__Vector_base<Connection,_std::allocator<Connection>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    for (this_00 = (pBVar2->connections).super__Vector_base<Connection,_std::allocator<Connection>_>
                   ._M_impl.super__Vector_impl_data._M_start; this_00 != pCVar3;
        this_00 = this_00 + 1) {
      if (((BaseNode *)this_00->output_node == pBVar2) &&
         (bVar6 = Connection::Prepare(this_00,this), !bVar6)) {
        return;
      }
    }
    ppBVar8 = ppBVar8 + 1;
  } while( true );
}

Assistant:

void RunContext::Run()
{
    pipeline.Clear();

    for (auto node : nodes)
    {
        for (auto& c : node->connections)
        {
            if (c.output_node != node)
                continue;
            if (!c.Prepare(*this))
            {
                return;
            }
        }
    }

    for (auto node : nodes)
    {
        if (!node->Prepare(*this))
        {
            return;
        }
    }

    pipeline.Launch();
}